

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

void fail(error_code eCode,char *what)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_RDX;
  error_code *this_00;
  error_code local_38 [3];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RDX);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar1,": ");
  this_00 = local_38;
  boost::system::error_code::message_abi_cxx11_(this_00);
  poVar1 = std::operator<<((ostream *)this,(string *)this_00);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(this);
  return;
}

Assistant:

static void fail(beast::error_code eCode, char const* what)
{
    std::cerr << what << ": " << eCode.message() << "\n";
}